

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O3

void __thiscall cppcms::xss::rules::html(rules *this,html_type t)

{
  bool bVar1;
  
  if (t == html_input) {
    bVar1 = false;
  }
  else {
    if (t != xhtml_input) {
      return;
    }
    bVar1 = true;
  }
  ((this->d).ptr_)->is_xhtml = bVar1;
  return;
}

Assistant:

void rules::html(rules::html_type t)
	{
		switch(t) {
		case html_input:
			d->is_xhtml=false;
			break;
		case xhtml_input:
			d->is_xhtml=true;
			break;
		}
	}